

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O0

int ERKStepReset(void *arkode_mem,realtype tR,N_Vector yR)

{
  realtype in_RSI;
  ARKodeMem in_XMM0_Qa;
  int retval;
  ARKodeERKStepMem step_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  ARKodeMem in_stack_ffffffffffffffd8;
  uint local_4;
  
  local_4 = erkStep_AccessStepMem
                      (in_stack_ffffffffffffffd8,
                       (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       (ARKodeMem *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (ARKodeERKStepMem *)0xea5e5f);
  if (local_4 == 0) {
    local_4 = arkInit(in_XMM0_Qa,in_RSI,(N_Vector)in_stack_ffffffffffffffd8,
                      in_stack_ffffffffffffffd4);
    if (local_4 == 0) {
      local_4 = 0;
    }
    else {
      arkProcessError(in_stack_ffffffffffffffd8,(int)(ulong)local_4,"ARKode::ERKStep","ERKStepReset"
                      ,"Unable to initialize main ARKode infrastructure");
    }
  }
  return local_4;
}

Assistant:

int ERKStepReset(void* arkode_mem, realtype tR, N_Vector yR)
{
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;
  int retval;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(arkode_mem, "ERKStepReset",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* Initialize main ARKode infrastructure */
  retval = arkInit(ark_mem, tR, yR, RESET_INIT);

  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, retval, "ARKode::ERKStep", "ERKStepReset",
                    "Unable to initialize main ARKode infrastructure");
    return(retval);
  }

  return(ARK_SUCCESS);
}